

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpmDsd.c
# Opt level: O1

void Mpm_ManPrintDsdStats(Mpm_Man_t *p)

{
  uint uVar1;
  ulong uVar2;
  long lVar3;
  
  lVar3 = 6;
  uVar2 = 0;
  uVar1 = 0;
  do {
    if (p->nCountDsd[uVar2] == 0) {
      uVar1 = uVar1 + 1;
    }
    else if (p->pPars->fVeryVerbose != 0) {
      printf("%5d  :  ",uVar2 & 0xffffffff);
      printf("%-20s   ",*(undefined8 *)(&p->pDsd6->nVars + lVar3));
      printf("%8d ",(ulong)(uint)p->nCountDsd[uVar2]);
      putchar(10);
    }
    uVar2 = uVar2 + 1;
    lVar3 = lVar3 + 8;
  } while (uVar2 != 0x253);
  printf("Unused classes = %d (%.2f %%).  ",((double)(int)uVar1 * 100.0) / 595.0,(ulong)uVar1);
  printf("Non-DSD cuts = %d (%.2f %%).  ",((double)p->nNonDsd * 100.0) / (double)p->nCutsMergedAll);
  printf("No-match cuts = %d (%.2f %%).\n",((double)p->nNoMatch * 100.0) / (double)p->nCutsMergedAll
        );
  return;
}

Assistant:

void Mpm_ManPrintDsdStats( Mpm_Man_t * p )
{
    int i, Absent = 0;
    for ( i = 0; i < 595; i++ )
    {
        if ( p->nCountDsd[i] == 0 )
        {
            Absent++;
            continue;
        }
        if ( p->pPars->fVeryVerbose )
        {
            printf( "%5d  :  ", i );
            printf( "%-20s   ", p->pDsd6[i].pStr );
            printf( "%8d ",     p->nCountDsd[i] );
            printf( "\n" );
        }
    }
    printf( "Unused classes = %d (%.2f %%).  ",  Absent, 100.0 * Absent / 595 );
    printf( "Non-DSD cuts = %d (%.2f %%).  ",   p->nNonDsd, 100.0 * p->nNonDsd / p->nCutsMergedAll );
    printf( "No-match cuts = %d (%.2f %%).\n",  p->nNoMatch, 100.0 * p->nNoMatch / p->nCutsMergedAll );
}